

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

void __thiscall cppcms::crypto::hmac::hmac(hmac *this,string *name,key *k)

{
  int iVar1;
  pointer pmVar2;
  string *s;
  undefined4 extraout_var;
  hmac *in_RDI;
  string *in_stack_00000028;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *in_stack_ffffffffffffff68;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *__p;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *in_stack_ffffffffffffff70;
  key *in_stack_ffffffffffffff78;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX *ctx;
  
  booster::noncopyable::noncopyable((noncopyable *)in_RDI);
  booster::hold_ptr<cppcms::crypto::hmac::data_>::hold_ptr(&in_RDI->d);
  this_00 = (invalid_argument *)&in_RDI->md_;
  std::
  unique_ptr<cppcms::crypto::message_digest,std::default_delete<cppcms::crypto::message_digest>>::
  unique_ptr<std::default_delete<cppcms::crypto::message_digest>,void>(in_stack_ffffffffffffff70);
  std::
  unique_ptr<cppcms::crypto::message_digest,std::default_delete<cppcms::crypto::message_digest>>::
  unique_ptr<std::default_delete<cppcms::crypto::message_digest>,void>(in_stack_ffffffffffffff70);
  crypto::key::key((key *)this_00,in_stack_ffffffffffffff78);
  message_digest::create_by_name(in_stack_00000028);
  std::
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>::
  operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>::
  ~unique_ptr(in_stack_ffffffffffffff70);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::get(in_stack_ffffffffffffff70);
  if (pmVar2 == (pointer)0x0) {
    s = (string *)__cxa_allocate_exception(0x30);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    booster::invalid_argument::invalid_argument(this_00,s);
    __cxa_throw(s,&booster::invalid_argument::typeinfo,booster::invalid_argument::~invalid_argument)
    ;
  }
  __p = &in_RDI->md_opad_;
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453b42);
  iVar1 = (*pmVar2->_vptr_message_digest[6])();
  ctx = (EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar1);
  std::
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>::
  reset((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
         *)ctx,(pointer)__p);
  init(in_RDI,ctx);
  return;
}

Assistant:

hmac::hmac(std::string const &name,key const &k) : key_(k)
	{
		md_ = message_digest::create_by_name(name);
		if(!md_.get()) {
			throw booster::invalid_argument("Invalid or unsupported hash function:" + name);
		}
		md_opad_.reset(md_->clone());
		init();
	}